

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFixed64Array
               (uint64 *a,int n,CodedOutputStream *output)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  WriteArray<unsigned_long>
            ((unsigned_long *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDX >> 0x20),(CodedOutputStream *)0x3fe603);
  return;
}

Assistant:

void WireFormatLite::WriteFixed64Array(const uint64* a, int n,
                                       io::CodedOutputStream* output) {
  WriteArray<uint64>(a, n, output);
}